

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O3

TraceGeodesicResult *
geometrycentral::surface::traceGeodesic
          (TraceGeodesicResult *__return_storage_ptr__,IntrinsicGeometryInterface *geom,
          Face startFace,Vector3 startBary,Vector3 traceBaryVec,TraceOptions *traceOptions)

{
  bool bVar1;
  pointer puVar2;
  IntrinsicGeometryInterface *geom_00;
  unsigned_long uVar3;
  unsigned_long uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3 startPoint;
  TraceSubResult prevTraceEnd_00;
  Vector3 vecBary;
  runtime_error *this;
  ParentMeshT *pPVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  Vector2 vecCartesianDir;
  TraceSubResult prevTraceEnd;
  undefined1 local_d8 [16];
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  ParentMeshT *pPStack_a8;
  size_t sStack_a0;
  ParentMeshT *local_98;
  double dStack_90;
  ParentMeshT *pPStack_88;
  size_t sStack_80;
  double dStack_78;
  ParentMeshT *pPStack_70;
  size_t sStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  
  pPVar9 = startFace.
           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
  ;
  IntrinsicGeometryInterface::requireVertexAngleSums(geom);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInVertex(geom);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInFace(geom);
  (__return_storage_ptr__->endPoint).type = Vertex;
  (__return_storage_ptr__->endPoint).vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)0x0;
  (__return_storage_ptr__->endPoint).vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       0xffffffffffffffff;
  (__return_storage_ptr__->endPoint).edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)0x0;
  (__return_storage_ptr__->endPoint).edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
       0xffffffffffffffff;
  (__return_storage_ptr__->endPoint).tEdge = NAN;
  (__return_storage_ptr__->endPoint).face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)0x0;
  (__return_storage_ptr__->endPoint).face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       0xffffffffffffffff;
  (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
  (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
  (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
  (__return_storage_ptr__->pathPoints).
  super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pathPoints).
  super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pathPoints).
  super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->hitBoundary = false;
  bVar1 = traceOptions->includePath;
  __return_storage_ptr__->hasPath = bVar1;
  if (bVar1 == true) {
    pPStack_88 = (ParentMeshT *)startBary.z;
    local_98 = (ParentMeshT *)startBary.x;
    dStack_90 = startBary.y;
    local_d8._0_4_ = 2;
    local_d8._8_8_ = 0;
    dStack_c8 = -NAN;
    dStack_c0 = 0.0;
    dStack_b8 = -NAN;
    dStack_b0 = NAN;
    pPStack_a8 = pPVar9;
    sStack_a0 = startFace.
                super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                .ind;
    ::std::
    vector<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
    ::_M_realloc_insert<geometrycentral::surface::SurfacePoint>
              (&__return_storage_ptr__->pathPoints,(iterator)0x0,(SurfacePoint *)local_d8);
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = traceBaryVec.x;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = traceBaryVec.z;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = traceBaryVec.y * traceBaryVec.y;
  auVar14 = vfmadd231sd_fma(auVar18,auVar14,auVar14);
  auVar14 = vfmadd231sd_fma(auVar14,auVar15,auVar15);
  if ((auVar14._0_8_ != 0.0) || (NAN(auVar14._0_8_))) {
    dVar19 = dStack_c0;
    dStack_c8 = startBary.z;
    local_d8 = startBary._0_16_;
    auVar10._0_24_ = local_d8._0_24_;
    auVar10._24_8_ = 0;
    auVar10 = vmaxpd_avx(auVar10,ZEXT832(0) << 0x40);
    auVar11._0_24_ = auVar10._0_24_;
    auVar11._24_8_ = dVar19;
    local_d8._0_8_ = auVar10._0_8_;
    local_d8._8_8_ = auVar10._8_8_;
    dStack_c8 = auVar10._16_8_;
    dVar19 = (double)local_d8._0_8_ + (double)local_d8._8_8_ + dStack_c8;
    bVar1 = dVar19 == 0.0;
    dVar19 = 1.0 / dVar19;
    dVar16 = (traceBaryVec.x + traceBaryVec.y + traceBaryVec.z) / 3.0;
    dVar6 = traceBaryVec.y - dVar16;
    dVar7 = traceBaryVec.z - dVar16;
    dVar5 = (traceBaryVec.x - dVar16) * 0.0;
    puVar2 = (pPVar9->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    geom_00 = (IntrinsicGeometryInterface *)
              (geom->halfedgeVectorsInFace).data.
              super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar3 = (pPVar9->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start
            [startFace.
             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
             ind];
    uVar4 = puVar2[puVar2[uVar3]];
    dVar8 = (dVar5 + dVar6 * (double)(&(geom_00->super_BaseGeometryInterface).
                                       _vptr_BaseGeometryInterface)[uVar3 * 2]) -
            dVar7 * (double)(&(geom_00->super_BaseGeometryInterface)._vptr_BaseGeometryInterface)
                            [uVar4 * 2];
    dVar5 = (dVar5 + dVar6 * (double)(&(geom_00->super_BaseGeometryInterface).mesh)[uVar3 * 2]) -
            dVar7 * (double)(&(geom_00->super_BaseGeometryInterface).mesh)[uVar4 * 2];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar5 * dVar5;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar8;
    auVar14 = vfmadd231sd_fma(auVar12,auVar13,auVar13);
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    dVar17 = 1.0 / auVar14._0_8_;
    startPoint.y = (double)((ulong)bVar1 * 0x3fd5555555555555 +
                           (ulong)!bVar1 * (long)((double)local_d8._8_8_ * dVar19));
    startPoint.x = (double)((ulong)bVar1 * 0x3fd5555555555555 +
                           (ulong)!bVar1 * (long)((double)local_d8._0_8_ * dVar19));
    startPoint.z = (double)((ulong)bVar1 * 0x3fd5555555555555 +
                           (ulong)!bVar1 * (long)(dStack_c8 * dVar19));
    vecBary.y = dVar6;
    vecBary.x = traceBaryVec.x - dVar16;
    vecBary.z = dVar7;
    vecCartesianDir.y = dVar5 * dVar17;
    vecCartesianDir.x = dVar8 * dVar17;
    _local_d8 = auVar11;
    anon_unknown_2::traceInFaceBarycentric
              ((TraceSubResult *)local_d8,geom_00,startFace,startPoint,vecBary,vecCartesianDir,
               auVar14._0_8_,(array<bool,_3UL>)0x10101,
               (TraceOptions *)(ulong)traceOptions->errorOnProblem);
    auVar10 = _local_d8;
    prevTraceEnd_00.traceVectorInHalfedgeDir.x = dStack_b8;
    prevTraceEnd_00.terminated = (bool)local_d8[0];
    prevTraceEnd_00._1_7_ = local_d8._1_7_;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)local_d8._8_8_;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)dStack_c8;
    prevTraceEnd_00.tCross = dStack_c0;
    prevTraceEnd_00.traceVectorInHalfedgeDir.y = dStack_b0;
    prevTraceEnd_00.traceVectorInHalfedgeLen = (double)pPStack_a8;
    prevTraceEnd_00.endPoint._0_8_ = sStack_a0;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         local_98;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)dStack_90;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPStack_88;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         sStack_80;
    prevTraceEnd_00.endPoint.tEdge = dStack_78;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPStack_70;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         sStack_68;
    prevTraceEnd_00.endPoint.faceCoords.x = dStack_60;
    prevTraceEnd_00.endPoint.faceCoords.y = dStack_58;
    prevTraceEnd_00.endPoint.faceCoords.z = dStack_50;
    prevTraceEnd_00.incomingDirToPoint.x = dStack_48;
    prevTraceEnd_00.incomingDirToPoint.y = dStack_40;
    _local_d8 = auVar10;
    anon_unknown_2::traceGeodesic_iterative
              (geom,__return_storage_ptr__,prevTraceEnd_00,traceOptions);
    IntrinsicGeometryInterface::unrequireVertexAngleSums(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace(geom);
  }
  else {
    IntrinsicGeometryInterface::unrequireVertexAngleSums(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace(geom);
    if (traceOptions->errorOnProblem == true) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this,"zero vec passed to trace, do something good here");
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->endingDir).x = 0.0;
    (__return_storage_ptr__->endingDir).y = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

TraceGeodesicResult traceGeodesic(IntrinsicGeometryInterface& geom, Face startFace, Vector3 startBary,
                                  Vector3 traceBaryVec, const TraceOptions& traceOptions) {


  geom.requireVertexAngleSums();
  geom.requireHalfedgeVectorsInVertex();
  geom.requireHalfedgeVectorsInFace();

  // The output data
  TraceGeodesicResult result;
  result.hasPath = traceOptions.includePath;
  if (traceOptions.includePath) {
    result.pathPoints.push_back(SurfacePoint(startFace, startBary));
  }

  if (TRACE_PRINT) {
    cout << "\n>>> Trace query (barycentric) from " << startFace << " " << startBary << " vec = " << traceBaryVec
         << endl;
  }

  // Early-out if zero
  if (traceBaryVec.norm2() == 0) {
    geom.unrequireVertexAngleSums();
    geom.unrequireHalfedgeVectorsInVertex();
    geom.unrequireHalfedgeVectorsInFace();

    // probably want to ensure we still return a point in a face...
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("zero vec passed to trace, do something good here");
    }

    result.endingDir = Vector2::zero();
    return result;
  }

  // Make sure the input is sane
  startBary = projectInsideTriangle(startBary);
  traceBaryVec -= Vector3::constant(sum(traceBaryVec) / 3);

  // Construct the cartesian equivalent
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, startFace);
  Vector2 traceVectorCartesian = barycentricDisplacementToCartesian(vertexCoords, traceBaryVec);

  // Trace the first point starting inside the face
  TraceSubResult prevTraceEnd =
      traceInFaceBarycentric(geom, startFace, startBary, traceBaryVec, unit(traceVectorCartesian),
                             norm(traceVectorCartesian), {true, true, true}, traceOptions);

  // Keep tracing through triangles until finished
  traceGeodesic_iterative(geom, result, prevTraceEnd, traceOptions);

  geom.unrequireVertexAngleSums();
  geom.unrequireHalfedgeVectorsInVertex();
  geom.unrequireHalfedgeVectorsInFace();

  return result;
}